

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

string * __thiscall LTAircraft::GetFlightId_abi_cxx11_(LTAircraft *this)

{
  string *psVar1;
  FDStaticData *in_RDI;
  FDStaticData stat;
  string local_1c8 [8];
  string *in_stack_fffffffffffffe40;
  FDStaticData *in_stack_fffffffffffffe48;
  LTFlightData *in_stack_fffffffffffffe68;
  
  LTFlightData::WaitForSafeCopyStat(in_stack_fffffffffffffe68);
  psVar1 = key_abi_cxx11_((LTAircraft *)0x19605b);
  std::__cxx11::string::string(local_1c8,(string *)psVar1);
  LTFlightData::FDStaticData::acId(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_1c8);
  LTFlightData::FDStaticData::~FDStaticData(in_RDI);
  return &in_RDI->reg;
}

Assistant:

std::string LTAircraft::GetFlightId() const
{
    LTFlightData::FDStaticData stat = fd.WaitForSafeCopyStat();
    return stat.acId(key());
}